

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O2

Var Js::JsBuiltInEngineInterfaceExtensionObject::
    EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  JavascriptArray *this;
  ScriptContext *in_R9;
  double dVar5;
  BigIndex index;
  uint in_stack_00000010;
  Var in_stack_00000020;
  Var in_stack_00000028;
  uint64 in_stack_00000030;
  undefined1 local_48 [8];
  BigIndex bigIndex;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd189d;
    *puVar4 = 0;
  }
  if ((callInfo._0_4_ >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00bd189d;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)callInfo & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,500,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd189d;
    *puVar4 = 0;
LAB_00bd1783:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f5,"(args.Info.Count == 4)","args.Info.Count == 4");
    if (!bVar3) goto LAB_00bd189d;
    *puVar4 = 0;
  }
  else if ((int)((ulong)callInfo & 0xffffff) != 4) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    goto LAB_00bd1783;
  }
  this = (JavascriptArray *)VarTo<Js::RecyclableObject>(in_stack_00000020);
  dVar5 = JavascriptConversion::ToInteger(in_stack_00000028,pSVar1);
  if (dVar5 < 0.0) {
    AssertCount = AssertCount + 1;
    bigIndex.bigIndex = (uint64)dVar5;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                ,0x1f9,"(index >= 0)","index >= 0");
    if (!bVar3) {
LAB_00bd189d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    dVar5 = (double)bigIndex.bigIndex;
  }
  JavascriptArray::BigIndex::BigIndex
            ((BigIndex *)local_48,
             (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5);
  index.bigIndex = in_stack_00000030;
  index.index = bigIndex.index;
  index._4_4_ = bigIndex._4_4_;
  JavascriptArray::CreateDataPropertyOrThrow
            (this,(RecyclableObject *)(ulong)(uint)local_48._0_4_,index,pSVar1,in_R9);
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         booleanTrue.ptr;
}

Assistant:

Var JsBuiltInEngineInterfaceExtensionObject::EntryJsBuiltIn_Internal_ArrayCreateDataPropertyOrThrow(RecyclableObject *function, CallInfo callInfo, ...)
    {
        EngineInterfaceObject_CommonFunctionProlog(function, callInfo);
        AssertOrFailFast(args.Info.Count == 4);

        RecyclableObject * obj = VarTo<RecyclableObject>(args.Values[1]);
        double index = JavascriptConversion::ToInteger(args.Values[2], scriptContext);
        AssertOrFailFast(index >= 0);
        JavascriptArray::BigIndex bigIndex(static_cast<uint64>(index));
        Var item = args.Values[3];

        JavascriptArray::CreateDataPropertyOrThrow(obj, bigIndex, item, scriptContext);
        return scriptContext->GetLibrary()->GetTrue();
    }